

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O0

aiNode * ImportNode(aiScene *pScene,Asset *r,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets,
                   Ref<glTF::Node> *ptr)

{
  value_type vVar1;
  aiCamera **ppaVar2;
  aiLight **ppaVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  Node *pNVar7;
  aiNode *this;
  size_type sVar8;
  ulong uVar9;
  aiNode **ppaVar10;
  reference ptr_00;
  aiNode *paVar11;
  aiMatrix4x4 *m;
  reference pvVar12;
  reference pvVar13;
  uint *puVar14;
  uint local_248;
  uint j;
  int idx_1;
  size_t i_2;
  int k;
  int idx;
  size_t i_1;
  int count;
  aiMatrix4x4t<float> local_200;
  aiMatrix4x4t<float> local_1c0;
  undefined1 local_180 [8];
  aiQuaternion rot;
  undefined1 local_130 [8];
  aiMatrix4x4 s;
  aiVector3D scal;
  undefined1 local_a4 [8];
  aiMatrix4x4 t;
  aiVector3D trans;
  aiMatrix4x4 *matrix;
  aiNode *child;
  uint i;
  aiNode *ainode;
  Node *node;
  Ref<glTF::Node> *ptr_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets_local;
  Asset *r_local;
  aiScene *pScene_local;
  
  pNVar7 = glTF::Ref<glTF::Node>::operator*(ptr);
  this = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this,&(pNVar7->super_Object).id);
  bVar5 = std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::empty
                    (&pNVar7->children);
  if (!bVar5) {
    sVar8 = std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::size
                      (&pNVar7->children);
    this->mNumChildren = (uint)sVar8;
    auVar4 = ZEXT416(this->mNumChildren) * ZEXT816(8);
    uVar9 = auVar4._0_8_;
    if (auVar4._8_8_ != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    ppaVar10 = (aiNode **)operator_new__(uVar9);
    this->mChildren = ppaVar10;
    for (child._0_4_ = 0; (uint)child < this->mNumChildren; child._0_4_ = (uint)child + 1) {
      ptr_00 = std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::
               operator[](&pNVar7->children,(ulong)(uint)child);
      paVar11 = ImportNode(pScene,r,meshOffsets,ptr_00);
      paVar11->mParent = this;
      this->mChildren[(uint)child] = paVar11;
    }
  }
  m = &this->mTransformation;
  if (((pNVar7->matrix).isPresent & 1U) == 0) {
    if (((pNVar7->translation).isPresent & 1U) != 0) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&t.d3);
      glTFCommon::CopyValue((pNVar7->translation).value,(aiVector3D *)&t.d3);
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_a4);
      aiMatrix4x4t<float>::Translation((aiVector3t<float> *)&t.d3,(aiMatrix4x4t<float> *)local_a4);
      aiMatrix4x4t<float>::operator*
                ((aiMatrix4x4t<float> *)&scal.y,(aiMatrix4x4t<float> *)local_a4,m);
      memcpy(m,&scal.y,0x40);
    }
    if (((pNVar7->scale).isPresent & 1U) != 0) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&s.d3,1.0);
      glTFCommon::CopyValue((pNVar7->scale).value,(aiVector3D *)&s.d3);
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_130);
      aiMatrix4x4t<float>::Scaling((aiVector3t<float> *)&s.d3,(aiMatrix4x4t<float> *)local_130);
      aiMatrix4x4t<float>::operator*
                ((aiMatrix4x4t<float> *)&rot.y,(aiMatrix4x4t<float> *)local_130,m);
      memcpy(m,&rot.y,0x40);
    }
    if (((pNVar7->rotation).isPresent & 1U) != 0) {
      aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)local_180);
      glTFCommon::CopyValue((pNVar7->rotation).value,(aiQuaternion *)local_180);
      aiQuaterniont<float>::GetMatrix
                ((aiMatrix3x3t<float> *)((long)&i_1 + 4),(aiQuaterniont<float> *)local_180);
      aiMatrix4x4t<float>::aiMatrix4x4t(&local_200,(aiMatrix3x3t<float> *)((long)&i_1 + 4));
      aiMatrix4x4t<float>::operator*(&local_1c0,&local_200,m);
      memcpy(m,&local_1c0,0x40);
    }
  }
  else {
    glTFCommon::CopyValue((pNVar7->matrix).value,m);
  }
  bVar5 = std::vector<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>::empty
                    (&pNVar7->meshes);
  if (!bVar5) {
    i_1._0_4_ = 0;
    for (_k = 0; sVar8 = std::vector<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                         ::size(&pNVar7->meshes), _k < sVar8; _k = _k + 1) {
      pvVar12 = std::vector<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>::
                operator[](&pNVar7->meshes,_k);
      uVar6 = glTF::Ref<glTF::Mesh>::GetIndex(pvVar12);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (meshOffsets,(long)(int)(uVar6 + 1));
      vVar1 = *pvVar13;
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (meshOffsets,(long)(int)uVar6);
      i_1._0_4_ = (vVar1 - *pvVar13) + (uint)i_1;
    }
    this->mNumMeshes = (uint)i_1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)(int)(uint)i_1;
    uVar9 = SUB168(auVar4 * ZEXT816(4),0);
    if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    puVar14 = (uint *)operator_new__(uVar9);
    this->mMeshes = puVar14;
    i_2._0_4_ = 0;
    for (_j = 0; sVar8 = std::vector<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                         ::size(&pNVar7->meshes), _j < sVar8; _j = _j + 1) {
      pvVar12 = std::vector<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>::
                operator[](&pNVar7->meshes,_j);
      uVar6 = glTF::Ref<glTF::Mesh>::GetIndex(pvVar12);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (meshOffsets,(long)(int)uVar6);
      for (local_248 = *pvVar13;
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (meshOffsets,(long)(int)(uVar6 + 1)), local_248 < *pvVar13;
          local_248 = local_248 + 1) {
        this->mMeshes[(int)i_2] = local_248;
        i_2._0_4_ = (int)i_2 + 1;
      }
    }
  }
  bVar5 = glTF::Ref::operator_cast_to_bool((Ref *)&pNVar7->camera);
  if (bVar5) {
    ppaVar2 = pScene->mCameras;
    uVar6 = glTF::Ref<glTF::Camera>::GetIndex(&pNVar7->camera);
    aiString::operator=(&ppaVar2[uVar6]->mName,(aiString *)this);
  }
  bVar5 = glTF::Ref::operator_cast_to_bool((Ref *)&pNVar7->light);
  if (bVar5) {
    ppaVar3 = pScene->mLights;
    uVar6 = glTF::Ref<glTF::Light>::GetIndex(&pNVar7->light);
    aiString::operator=(&ppaVar3[uVar6]->mName,(aiString *)this);
  }
  return this;
}

Assistant:

aiNode* ImportNode(aiScene* pScene, glTF::Asset& r, std::vector<unsigned int>& meshOffsets, glTF::Ref<glTF::Node>& ptr)
{
    Node& node = *ptr;

    aiNode* ainode = new aiNode(node.id);

    if (!node.children.empty()) {
        ainode->mNumChildren = unsigned(node.children.size());
        ainode->mChildren = new aiNode*[ainode->mNumChildren];

        for (unsigned int i = 0; i < ainode->mNumChildren; ++i) {
            aiNode* child = ImportNode(pScene, r, meshOffsets, node.children[i]);
            child->mParent = ainode;
            ainode->mChildren[i] = child;
        }
    }

    aiMatrix4x4& matrix = ainode->mTransformation;
    if (node.matrix.isPresent) {
        CopyValue(node.matrix.value, matrix);
    }
    else {
        if (node.translation.isPresent) {
            aiVector3D trans;
            CopyValue(node.translation.value, trans);
            aiMatrix4x4 t;
            aiMatrix4x4::Translation(trans, t);
            matrix = t * matrix;
        }

        if (node.scale.isPresent) {
            aiVector3D scal(1.f);
            CopyValue(node.scale.value, scal);
            aiMatrix4x4 s;
            aiMatrix4x4::Scaling(scal, s);
            matrix = s * matrix;
        }


        if (node.rotation.isPresent) {
            aiQuaternion rot;
            CopyValue(node.rotation.value, rot);
            matrix = aiMatrix4x4(rot.GetMatrix()) * matrix;
        }
    }

    if (!node.meshes.empty()) {
        int count = 0;
        for (size_t i = 0; i < node.meshes.size(); ++i) {
            int idx = node.meshes[i].GetIndex();
            count += meshOffsets[idx + 1] - meshOffsets[idx];
        }

        ainode->mNumMeshes = count;
        ainode->mMeshes = new unsigned int[count];

        int k = 0;
        for (size_t i = 0; i < node.meshes.size(); ++i) {
            int idx = node.meshes[i].GetIndex();
            for (unsigned int j = meshOffsets[idx]; j < meshOffsets[idx + 1]; ++j, ++k) {
                ainode->mMeshes[k] = j;
            }
        }
    }

    if (node.camera) {
        pScene->mCameras[node.camera.GetIndex()]->mName = ainode->mName;
    }

    if (node.light) {
        pScene->mLights[node.light.GetIndex()]->mName = ainode->mName;
    }

    return ainode;
}